

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::ImFont(ImFont *this)

{
  (this->IndexLookup).Size = 0;
  (this->IndexLookup).Capacity = 0;
  (this->IndexLookup).Data = (unsigned_short *)0x0;
  (this->IndexAdvanceX).Size = 0;
  (this->IndexAdvanceX).Capacity = 0;
  (this->IndexAdvanceX).Data = (float *)0x0;
  (this->Glyphs).Size = 0;
  (this->Glyphs).Capacity = 0;
  (this->Glyphs).Data = (ImFontGlyph *)0x0;
  this->Scale = 1.0;
  this->FallbackChar = 0x3f;
  (this->DisplayOffset).x = 0.0;
  (this->DisplayOffset).y = 0.0;
  ClearOutputData(this);
  return;
}

Assistant:

ImFont::ImFont()
{
    Scale = 1.0f;
    FallbackChar = (ImWchar)'?';
    DisplayOffset = ImVec2(0.0f, 0.0f);
    ClearOutputData();
}